

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftRightOperator,bool,false,false>
               (uhugeint_t *ldata,uhugeint_t *rdata,uhugeint_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  uint64_t *puVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  uhugeint_t shift;
  uhugeint_t shift_00;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uhugeint_t uVar9;
  uint64_t in_stack_ffffffffffffff68;
  uhugeint_t local_88;
  uhugeint_t local_78;
  uhugeint_t local_68;
  idx_t local_58;
  ulong local_50;
  ValidityMask *local_48;
  ulong local_40;
  ulong local_38;
  
  local_48 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar7 = 0;
      do {
        local_88.lower = *(uint64_t *)((long)&rdata->lower + lVar7);
        local_88.upper = *(uint64_t *)((long)&rdata->upper + lVar7);
        puVar1 = (uint64_t *)((long)&ldata->lower + lVar7);
        local_68.lower = *puVar1;
        local_68.upper = puVar1[1];
        uVar9.upper = in_stack_ffffffffffffff68;
        uVar9.lower = 0x1c25c36;
        bVar4 = RightShiftInRange<duckdb::uhugeint_t>(uVar9);
        if (bVar4) {
          uVar9 = uhugeint_t::operator>>(&local_68,&local_88);
        }
        else {
          uhugeint_t::uhugeint_t(&local_78,0);
          uVar9 = local_78;
        }
        *(uint64_t *)((long)&result_data->lower + lVar7) = uVar9.lower;
        *(uint64_t *)((long)&result_data->upper + lVar7) = uVar9.upper;
        lVar7 = lVar7 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_50 = count + 0x3f >> 6;
    local_40 = 0;
    uVar8 = 0;
    local_58 = count;
    do {
      puVar2 = (local_48->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar5 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar5 = count;
        }
LAB_01c25b69:
        uVar6 = uVar8;
        if (uVar8 < uVar5) {
          lVar7 = uVar8 << 4;
          do {
            local_88.lower = *(uint64_t *)((long)&rdata->lower + lVar7);
            local_88.upper = *(uint64_t *)((long)&rdata->upper + lVar7);
            puVar1 = (uint64_t *)((long)&ldata->lower + lVar7);
            local_68.lower = *puVar1;
            local_68.upper = puVar1[1];
            shift_00.upper = in_stack_ffffffffffffff68;
            shift_00.lower = 0x1c25b9d;
            bVar4 = RightShiftInRange<duckdb::uhugeint_t>(shift_00);
            if (bVar4) {
              uVar9 = uhugeint_t::operator>>(&local_68,&local_88);
            }
            else {
              uhugeint_t::uhugeint_t(&local_78,0);
              uVar9 = local_78;
            }
            *(uint64_t *)((long)&result_data->lower + lVar7) = uVar9.lower;
            *(uint64_t *)((long)&result_data->upper + lVar7) = uVar9.upper;
            uVar8 = uVar8 + 1;
            lVar7 = lVar7 + 0x10;
            uVar6 = uVar5;
            count = local_58;
          } while (uVar5 != uVar8);
        }
      }
      else {
        uVar3 = puVar2[local_40];
        uVar5 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar5 = count;
        }
        uVar6 = uVar5;
        if (uVar3 != 0) {
          if (uVar3 == 0xffffffffffffffff) goto LAB_01c25b69;
          local_38 = uVar5 - uVar8;
          uVar6 = uVar8;
          if (uVar8 <= uVar5 && local_38 != 0) {
            lVar7 = uVar8 << 4;
            uVar8 = 0;
            do {
              if ((uVar3 >> (uVar8 & 0x3f) & 1) != 0) {
                local_88.lower = *(uint64_t *)((long)&rdata->lower + lVar7);
                local_88.upper = *(uint64_t *)((long)&rdata->upper + lVar7);
                puVar1 = (uint64_t *)((long)&ldata->lower + lVar7);
                local_68.lower = *puVar1;
                local_68.upper = puVar1[1];
                shift.upper = in_stack_ffffffffffffff68;
                shift.lower = 0x1c25b1a;
                bVar4 = RightShiftInRange<duckdb::uhugeint_t>(shift);
                if (bVar4) {
                  uVar9 = uhugeint_t::operator>>(&local_68,&local_88);
                }
                else {
                  uhugeint_t::uhugeint_t(&local_78,0);
                  uVar9 = local_78;
                }
                *(uint64_t *)((long)&result_data->lower + lVar7) = uVar9.lower;
                *(uint64_t *)((long)&result_data->upper + lVar7) = uVar9.upper;
              }
              uVar8 = uVar8 + 1;
              lVar7 = lVar7 + 0x10;
              uVar6 = uVar5;
              count = local_58;
            } while (local_38 != uVar8);
          }
        }
      }
      local_40 = local_40 + 1;
      uVar8 = uVar6;
    } while (local_40 != local_50);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}